

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O2

Aig_ManCut_t * Aig_ComputeCuts(Aig_Man_t *pAig,int nCutsMax,int nLeafMax,int fTruth,int fVerbose)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Aig_ManCut_t *p;
  Aig_Obj_t *pAVar4;
  abctime aVar5;
  int level;
  int iVar6;
  int nCutsK;
  
  aVar3 = Abc_Clock();
  if (pAig->pManCuts == (void *)0x0) {
    p = Aig_ManCutStart(pAig,nCutsMax,nLeafMax,fTruth,fVerbose);
    for (iVar6 = 0; iVar6 < pAig->vCis->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar6);
      Aig_ObjPrepareCuts(p,pAVar4,1);
    }
    for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar6);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        Aig_ObjComputeCuts(p,pAVar4,1);
      }
    }
    if (fVerbose != 0) {
      uVar1 = Aig_ManCutCount(p,&nCutsK);
      printf("Nodes = %6d. Total cuts = %6d. %d-input cuts = %6d.\n",
             (ulong)(uint)(pAig->vObjs->nSize - pAig->nDeleted),(ulong)uVar1,(ulong)(uint)nLeafMax,
             (ulong)(uint)nCutsK);
      uVar1 = p->nCutSize;
      iVar6 = p->nTruthWords;
      iVar2 = Aig_MmFixedReadMemUsage(p->pMemCuts);
      level = 0x80cdf7;
      printf("Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
             (double)iVar2 * 9.5367431640625e-07,(ulong)uVar1,(ulong)(uint)(iVar6 << 2));
      Abc_Print(level,"%s =","Runtime");
      aVar5 = Abc_Clock();
      Abc_Print(level,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
    }
    pAig->pManCuts = p;
    return p;
  }
  __assert_fail("pAig->pManCuts == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                ,0x27d,"Aig_ManCut_t *Aig_ComputeCuts(Aig_Man_t *, int, int, int, int)");
}

Assistant:

Aig_ManCut_t * Aig_ComputeCuts( Aig_Man_t * pAig, int nCutsMax, int nLeafMax, int fTruth, int fVerbose )
{
    Aig_ManCut_t * p;
    Aig_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    assert( pAig->pManCuts == NULL );
    // start the manager
    p = Aig_ManCutStart( pAig, nCutsMax, nLeafMax, fTruth, fVerbose );
    // set elementary cuts at the PIs
    Aig_ManForEachCi( pAig, pObj, i )
        Aig_ObjPrepareCuts( p, pObj, 1 );
    // process the nodes
    Aig_ManForEachNode( pAig, pObj, i )
        Aig_ObjComputeCuts( p, pObj, 1 );
    // print stats
    if ( fVerbose )
    {
        int nCuts, nCutsK;
        nCuts = Aig_ManCutCount( p, &nCutsK );
        printf( "Nodes = %6d. Total cuts = %6d. %d-input cuts = %6d.\n",
            Aig_ManObjNum(pAig), nCuts, nLeafMax, nCutsK );
        printf( "Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
            p->nCutSize, 4*p->nTruthWords, 1.0*Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
/*
        Aig_ManForEachNode( pAig, pObj, i )
            if ( i % 300 == 0 )
                Aig_ObjCutPrint( p, pObj );
*/
    }
    // remember the cut manager
    pAig->pManCuts = p;
    return p;
}